

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

short flatbuffers::tests::TestValue<short>(char *json,char *type_name,char *decls)

{
  bool bVar1;
  uint8_t *flatbuffer;
  char *pcVar2;
  uint *puVar3;
  ulong uVar4;
  int *piVar5;
  short sVar6;
  allocator<char> local_b5a;
  allocator<char> local_b59;
  string print_back;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  string schema;
  Parser parser;
  
  IDLOptions::IDLOptions((IDLOptions *)&schema);
  Parser::Parser(&parser,(IDLOptions *)&schema);
  IDLOptions::~IDLOptions((IDLOptions *)&schema);
  parser.builder_.force_defaults_ = true;
  if (json == (char *)0x0) {
    parser.opts.output_default_scalars_in_json = true;
  }
  pcVar2 = "";
  if (decls != (char *)0x0) {
    pcVar2 = decls;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b18,pcVar2,&local_b59);
  std::operator+(&local_af8,&local_b18,"\n");
  std::operator+(&local_ad8,&local_af8,"table X { y:");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b38,type_name,&local_b5a);
  std::operator+(&print_back,&local_ad8,&local_b38);
  std::operator+(&schema,&print_back,"; } root_type X;");
  std::__cxx11::string::~string((string *)&print_back);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::__cxx11::string::~string((string *)&local_af8);
  std::__cxx11::string::~string((string *)&local_b18);
  bVar1 = Parser::Parse(&parser,schema._M_dataplus._M_p,(char **)0x0,(char *)0x0);
  TestEqStr(parser.error_._M_dataplus._M_p,"","\'parser.error_.c_str()\' != \'\"\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
            ,0x1dd,"");
  TestEq<bool,bool>(bVar1,true,"\'schema_done\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x1de,"");
  pcVar2 = "{}";
  if (json != (char *)0x0) {
    pcVar2 = json;
  }
  bVar1 = Parser::Parse(&parser,pcVar2,(char **)0x0,(char *)0x0);
  TestEqStr(parser.error_._M_dataplus._M_p,"","\'parser.error_.c_str()\' != \'\"\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
            ,0x1e1,"");
  TestEq<bool,bool>(bVar1,true,"\'done\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x1e2,"");
  print_back._M_dataplus._M_p = (pointer)&print_back.field_2;
  print_back._M_string_length = 0;
  print_back.field_2._M_local_buf[0] = '\0';
  parser.opts.indent_step = -1;
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer(&parser.builder_);
  pcVar2 = GenText(&parser,flatbuffer,&print_back);
  TestEq<bool,bool>(true,pcVar2 == (char *)0x0,
                    "\'nullptr\' != \'GenText(parser, parser.builder_.GetBufferPointer(), &print_back)\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x1e7,"");
  if (json == (char *)0x0) {
    bVar1 = Parser::Parse(&parser,print_back._M_dataplus._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar1,true,"\'parser.Parse(print_back.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                      ,0x1e9,"");
  }
  puVar3 = (uint *)FlatBufferBuilderImpl<false>::GetBufferPointer(&parser.builder_);
  if (puVar3 == (uint *)0x0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)((ulong)*puVar3 + (long)puVar3);
  }
  if ((*(ushort *)((long)piVar5 - (long)*piVar5) < 5) ||
     (uVar4 = (ulong)*(ushort *)((long)piVar5 + (4 - (long)*piVar5)), uVar4 == 0)) {
    sVar6 = 0;
  }
  else {
    sVar6 = *(short *)((long)piVar5 + uVar4);
  }
  std::__cxx11::string::~string((string *)&print_back);
  std::__cxx11::string::~string((string *)&schema);
  Parser::~Parser(&parser);
  return sVar6;
}

Assistant:

T TestValue(const char *json, const char *type_name,
            const char *decls = nullptr) {
  flatbuffers::Parser parser;
  parser.builder_.ForceDefaults(true);  // return defaults
  auto check_default = json ? false : true;
  if (check_default) { parser.opts.output_default_scalars_in_json = true; }
  // Simple schema.
  std::string schema = std::string(decls ? decls : "") + "\n" +
                       "table X { y:" + std::string(type_name) +
                       "; } root_type X;";
  auto schema_done = parser.Parse(schema.c_str());
  TEST_EQ_STR(parser.error_.c_str(), "");
  TEST_EQ(schema_done, true);

  auto done = parser.Parse(check_default ? "{}" : json);
  TEST_EQ_STR(parser.error_.c_str(), "");
  TEST_EQ(done, true);

  // Check with print.
  std::string print_back;
  parser.opts.indent_step = -1;
  TEST_NULL(GenText(parser, parser.builder_.GetBufferPointer(), &print_back));
  // restore value from its default
  if (check_default) { TEST_EQ(parser.Parse(print_back.c_str()), true); }

  auto root = flatbuffers::GetRoot<flatbuffers::Table>(
      parser.builder_.GetBufferPointer());
  return root->GetField<T>(flatbuffers::FieldIndexToOffset(0), 0);
}